

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O0

int AF_DObject_S_ChangeMusic
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  FString *other;
  VMValue *pVVar4;
  char *musicname;
  int u;
  bool force;
  bool looping;
  int order;
  FString music;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  music.Chars._0_4_ = 0;
  music.Chars._4_4_ = numret;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/s_sound.cpp"
                  ,0xa35,
                  "int AF_DObject_S_ChangeMusic(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if ((param->field_0).field_3.Type != '\x02') {
    __assert_fail("param[paramnum].Type == REGT_STRING",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/s_sound.cpp"
                  ,0xa35,
                  "int AF_DObject_S_ChangeMusic(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  other = VMValue::s(param);
  FString::FString((FString *)&stack0xffffffffffffffc0,other);
  music.Chars._0_4_ = (int)music.Chars + 1;
  if ((int)music.Chars < numparam) {
    if (param[(int)music.Chars].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/s_sound.cpp"
                    ,0xa36,
                    "int AF_DObject_S_ChangeMusic(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    u = param[(int)music.Chars].field_0.i;
  }
  else {
    pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,(long)(int)music.Chars);
    if ((pVVar4->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/s_sound.cpp"
                    ,0xa36,
                    "int AF_DObject_S_ChangeMusic(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar4 = TArray<VMValue,_VMValue>::operator[](defaultparam,(long)(int)music.Chars);
    u = (pVVar4->field_0).i;
  }
  iVar3 = (int)music.Chars + 1;
  if (iVar3 < numparam) {
    if (param[iVar3].field_0.field_3.Type != '\0') {
      music.Chars._0_4_ = iVar3;
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/s_sound.cpp"
                    ,0xa37,
                    "int AF_DObject_S_ChangeMusic(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar3 = param[iVar3].field_0.i;
    music.Chars._0_4_ = (int)music.Chars + 2;
    if ((int)music.Chars < numparam) {
      if (param[(int)music.Chars].field_0.field_3.Type != '\0') {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/s_sound.cpp"
                      ,0xa38,
                      "int AF_DObject_S_ChangeMusic(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      iVar1 = param[(int)music.Chars].field_0.i;
      musicname = FString::operator_cast_to_char_((FString *)&stack0xffffffffffffffc0);
      bVar2 = S_ChangeMusic(musicname,u,iVar3 != 0,iVar1 != 0);
      if (music.Chars._4_4_ < 1) {
        param_local._4_4_ = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/s_sound.cpp"
                        ,0xa39,
                        "int AF_DObject_S_ChangeMusic(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        VMReturn::SetInt(ret,(uint)bVar2);
        param_local._4_4_ = 1;
      }
      FString::~FString((FString *)&stack0xffffffffffffffc0);
      return param_local._4_4_;
    }
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/s_sound.cpp"
                  ,0xa38,
                  "int AF_DObject_S_ChangeMusic(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  music.Chars._0_4_ = iVar3;
  __assert_fail("(paramnum) < numparam",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/s_sound.cpp"
                ,0xa37,
                "int AF_DObject_S_ChangeMusic(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(DObject, S_ChangeMusic)
{
	PARAM_PROLOGUE;
	PARAM_STRING(music);
	PARAM_INT_DEF(order);
	PARAM_BOOL(looping);
	PARAM_BOOL(force);
	ACTION_RETURN_BOOL(S_ChangeMusic(music, order, looping, force));
}